

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O3

longlong valence(char c)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,c);
  if (iVar1 < 0x4e) {
    if (iVar1 == 0x2e) {
      return -1;
    }
    if (iVar1 == 0x48) {
      return 1;
    }
  }
  else {
    if (iVar1 == 0x4e) {
      return 3;
    }
    if (iVar1 == 0x4f) {
      return 2;
    }
  }
  return 4;
}

Assistant:

long long valence(char c){
    if(c == '.') {
        return -1;
    }
    if(c == 'H') {
        return 1;
    }
    if(c == 'O') {
        return 2;
    }
    if(c == 'N') {
        return 3;
    }
    return 4;
}